

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int write_skip(AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t segment_id,MB_MODE_INFO *mi,aom_writer *w)

{
  int iVar1;
  long in_RCX;
  uint8_t in_DL;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  aom_writer *in_R8;
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  int skip_txfm;
  int in_stack_ffffffffffffffbc;
  uint local_4;
  
  iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\x06');
  if (iVar1 == 0) {
    local_4 = (uint)*(byte *)(in_RCX + 0x90);
    av1_get_skip_txfm_context(in_RSI);
    aom_write_symbol(in_R8,local_4,(aom_cdf_prob *)in_RSI->tile_ctx,in_stack_ffffffffffffffbc);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int write_skip(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      uint8_t segment_id, const MB_MODE_INFO *mi,
                      aom_writer *w) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int skip_txfm = mi->skip_txfm;
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    aom_write_symbol(w, skip_txfm, ec_ctx->skip_txfm_cdfs[ctx], 2);
    return skip_txfm;
  }
}